

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O3

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<chaiscript::AST_Node_const>
          (Object_Data *this,shared_ptr<const_chaiscript::AST_Node> *obj,bool t_return_value)

{
  element_type *peVar1;
  undefined8 *puVar2;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_20;
  
  detail::Any::Any<std::shared_ptr<chaiscript::AST_Node_const>const&,void>((Any *)&local_20,obj);
  peVar1 = (obj->super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  *(undefined8 *)this = 0;
  puVar2 = (undefined8 *)operator_new(0x50);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0030d160;
  puVar2[2] = &AST_Node::typeinfo;
  puVar2[3] = &AST_Node::typeinfo;
  *(undefined4 *)(puVar2 + 4) = 1;
  puVar2[5] = local_20._M_head_impl;
  puVar2[6] = 0;
  puVar2[7] = peVar1;
  puVar2[8] = 0;
  *(undefined1 *)(puVar2 + 9) = 0;
  *(bool *)((long)puVar2 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(const std::shared_ptr<T> &obj, bool t_return_value)
          {
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(obj), 
                  false,
                  obj.get(),
                  t_return_value
                );
          }